

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_hmi_midiout.cpp
# Opt level: O3

DWORD __thiscall HMISong::TrackInfo::ReadVarLenHMP(TrackInfo *this)

{
  byte *pbVar1;
  uint uVar2;
  byte bVar3;
  size_t sVar4;
  
  bVar3 = 0;
  uVar2 = 0;
  sVar4 = this->TrackP;
  do {
    if (this->MaxTrackP <= sVar4) {
      return uVar2;
    }
    this->TrackP = sVar4 + 1;
    pbVar1 = this->TrackBegin + sVar4;
    uVar2 = uVar2 | (*pbVar1 & 0x7f) << (bVar3 & 0x1f);
    bVar3 = bVar3 + 7;
    sVar4 = sVar4 + 1;
  } while (-1 < (char)*pbVar1);
  return uVar2;
}

Assistant:

DWORD HMISong::TrackInfo::ReadVarLenHMP()
{
	DWORD time = 0;
	BYTE t = 0;
	int off = 0;

	while (!(t & 0x80) && TrackP < MaxTrackP)
	{
		t = TrackBegin[TrackP++];
		time |= (t & 127) << off;
		off += 7;
	}
	return time;
}